

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O0

void __thiscall Fifteen::slotLoadGraphic(Fifteen *this)

{
  bool bVar1;
  byte bVar2;
  pointer this_00;
  pointer this_01;
  QFlags<QMessageBox::StandardButton> local_124;
  QString local_120;
  QString local_108;
  QFlags<QMessageBox::StandardButton> local_ec;
  QString local_e8;
  QString local_d0;
  QImage local_b8 [8];
  QImage image;
  QFlags<QFileDialog::Option> local_9c;
  QString local_98;
  QString local_80;
  QString local_58;
  QString local_40;
  undefined1 local_28 [8];
  QString file;
  Fifteen *this_local;
  
  file.d.size = (qsizetype)this;
  QString::QString((QString *)local_28,(char *)0x0);
  QString::QString(&local_58,"");
  QDir::currentPath();
  tr(&local_98,"JPG, PNG, GIF, BMP (*.jpg *.png *.gif *.bmp)",(char *)0x0,-1);
  QFlags<QFileDialog::Option>::QFlags(&local_9c);
  QFileDialog::getOpenFileName
            ((QWidget *)&local_40,(QString *)this,(QString *)&local_58,(QString *)&local_80,
             (QString *)&local_98,(QFlags_conflict *)0x0);
  QString::operator=((QString *)local_28,&local_40);
  QString::~QString(&local_40);
  QString::~QString(&local_98);
  QString::~QString(&local_80);
  QString::~QString(&local_58);
  bVar1 = QString::isEmpty((QString *)local_28);
  if (!bVar1) {
    QImage::QImage(local_b8);
    QImage::load((QString *)local_b8,local_28);
    bVar2 = QImage::isNull();
    if ((bVar2 & 1) == 0) {
      this_00 = std::unique_ptr<Controller,_std::default_delete<Controller>_>::operator->
                          (&this->controller);
      bVar1 = Controller::loadGraphic(this_00,local_b8);
      if (bVar1) {
        this_01 = std::unique_ptr<MenuBar,_std::default_delete<MenuBar>_>::operator->
                            (&this->menuBar);
        MenuBar::setActionMenuState(this_01,REM_GRAPHIC,true);
      }
      QString::QString(&local_108,"");
      Message::getMessages();
      QFlags<QMessageBox::StandardButton>::QFlags(&local_124,FirstButton);
      QMessageBox::information
                ((QWidget *)this,(QString *)&local_108,(QString *)&local_120,
                 (QFlags_conflict *)(ulong)(uint)local_124.i,NoButton);
      QString::~QString(&local_120);
      QString::~QString(&local_108);
    }
    else {
      QString::QString(&local_d0,"");
      QString::QString(&local_e8,"Failure of loading an image\t");
      QFlags<QMessageBox::StandardButton>::QFlags(&local_ec,FirstButton);
      QMessageBox::information
                ((QWidget *)this,(QString *)&local_d0,(QString *)&local_e8,
                 (QFlags_conflict *)(ulong)(uint)local_ec.i,NoButton);
      QString::~QString(&local_e8);
      QString::~QString(&local_d0);
    }
    QImage::~QImage(local_b8);
  }
  QString::~QString((QString *)local_28);
  return;
}

Assistant:

void Fifteen::slotLoadGraphic()
{
    QString file = nullptr;
    if ( file = QFileDialog::getOpenFileName( this, "", QDir::currentPath(), tr( "JPG, PNG, GIF, BMP (*.jpg *.png *.gif *.bmp)" ));
         file.isEmpty())
    {
        return;
    }

    QImage image;
    if ( image.load( file ); image.isNull() )
    {
        QMessageBox::information( this, "", "Failure of loading an image\t" );
        return;
    }

    if ( controller->loadGraphic( image ))
    {
        menuBar->setActionMenuState( ActionMenu::REM_GRAPHIC, true );
    }
    QMessageBox::information( this, "", Message::getMessages() );
}